

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crypt.cpp
# Opt level: O3

void __thiscall Decrypt::operator()(Decrypt *this,string *inputPath,ostream *os)

{
  uint *puVar1;
  long lVar2;
  size_t *outlen;
  uchar *out;
  uchar *out_00;
  uchar *in_R8;
  size_t in_R9;
  long lVar3;
  char deadChars;
  SequenceD<64> seq;
  ostringstream oss;
  ifstream is;
  char local_499;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  SequenceD<64> local_458;
  ostringstream local_3a8 [112];
  ios_base local_338 [264];
  long local_230 [3];
  uint auStack_218 [124];
  
  std::ifstream::ifstream(local_230,(string *)inputPath,_S_in|_S_bin|_S_ate);
  puVar1 = (uint *)((long)auStack_218 + *(long *)(local_230[0] + -0x18));
  *puVar1 = *puVar1 & 0xffffefff;
  lVar2 = std::istream::tellg();
  std::istream::seekg((long)local_230,_S_beg);
  std::operator>>((istream *)local_230,&local_499);
  SequenceD<64>::SequenceD(&local_458);
  lVar3 = lVar2 + 7;
  if (-1 < lVar2) {
    lVar3 = lVar2;
  }
  outlen = (size_t *)(ulong)('\0' < local_499);
  lVar3 = (lVar3 >> 3) - (long)outlen;
  if (0 < lVar3) {
    do {
      operator>>((istream *)local_230,&local_458);
      decrypt(this,(EVP_PKEY_CTX *)&local_458,out,outlen,in_R8,in_R9);
      operator<<(os,&local_458);
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  if ('\0' < local_499) {
    std::__cxx11::ostringstream::ostringstream(local_3a8);
    operator>>((istream *)local_230,&local_458);
    decrypt(this,(EVP_PKEY_CTX *)&local_458,out_00,outlen,in_R8,in_R9);
    operator<<((ostream *)local_3a8,&local_458);
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_498,&local_478,0,8 - (long)local_499);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_498._M_dataplus._M_p,local_498._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != &local_498.field_2) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_478._M_dataplus._M_p != &local_478.field_2) {
      operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(local_3a8);
    std::ios_base::~ios_base(local_338);
  }
  std::ifstream::close();
  local_458.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115cc8;
  local_458.m_other._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_458.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  local_458.super_Sequence._vptr_Sequence = (_func_int **)&PTR_shift_00115d08;
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            (&local_458.super_Sequence.m_bits.super__Deque_base<int,_std::allocator<int>_>);
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

void Decrypt::operator()(const std::string &inputPath, std::ostream &os) {
    // Read input file and tell it to not ignore whitespaces while reading
    std::ifstream is(inputPath, std::ios::in | std::ios::binary | std::ios::ate);
    is >> std::noskipws;

    auto size = is.tellg();
    is.seekg(0, std::ios::beg);

    // Read the number of dead characters upfront so that we know how to truncate
    // input at the end.
    char deadChars;
    is >> deadChars;

    // Decypher each sequence in a streaming fashion
    SequenceD<64> seq;
    auto total = (size / 8) - (deadChars > 0 ? 1 : 0);
    for (auto i = 0; i < total; ++i) {
        is >> seq;
        os << decrypt(seq);
    }

    // If there is at least one dead character...
    if (deadChars > 0) {
        // Read last  sequence in a string stream
        std::ostringstream oss{};
        is >> seq;
        oss << decrypt(seq);
        // and truncate resul
        os << oss.str().substr(0, 8 - deadChars);
    }

    is.close();
}